

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDComponentList::Internal_Create
          (ON_SubDComponentList *this,ON_SubD *subd,bool bAddVertices,bool bAddEdges,bool bAddFaces,
          bool bComponentInListMark,uint marked_component_count)

{
  ON_SimpleArray<ON_SubDComponentPtr> *this_00;
  element_type *peVar1;
  ON_SubDComponentList *pOVar2;
  bool bVar3;
  ON_SubDLevel *pOVar4;
  ON_SubDVertex *pOVar5;
  ON__UINT64 OVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ON_SubDVertexIterator vit;
  ON_SubDComponentPtr local_80;
  ON_SubDComponentList *local_78;
  ulong local_70;
  ON_SubDEdgeIterator local_68;
  
  Destroy(this);
  if (marked_component_count == 0) {
    uVar7 = 0;
  }
  else {
    uVar8 = 0;
    local_70 = 0;
    if (bAddFaces) {
      peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((peVar1 == (element_type *)0x0) ||
         (pOVar4 = peVar1->m_active_level, pOVar4 == (ON_SubDLevel *)0x0)) {
        pOVar4 = &ON_SubDLevel::Empty;
      }
      local_70 = (ulong)pOVar4->m_face_count;
    }
    if (bAddEdges) {
      peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((peVar1 == (element_type *)0x0) ||
         (pOVar4 = peVar1->m_active_level, pOVar4 == (ON_SubDLevel *)0x0)) {
        pOVar4 = &ON_SubDLevel::Empty;
      }
      uVar8 = pOVar4->m_edge_count;
    }
    uVar9 = 0;
    if (bAddVertices) {
      peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((peVar1 == (element_type *)0x0) ||
         (pOVar4 = peVar1->m_active_level, pOVar4 == (ON_SubDLevel *)0x0)) {
        pOVar4 = &ON_SubDLevel::Empty;
      }
      uVar9 = pOVar4->m_vertex_count;
    }
    uVar7 = 0;
    if (((uVar8 != 0 || (int)local_70 != 0) || uVar9 != 0) &&
       (uVar7 = 0, marked_component_count <= uVar8 + (int)local_70 + uVar9)) {
      this_00 = &this->m_component_list;
      local_78 = this;
      ON_SimpleArray<ON_SubDComponentPtr>::Reserve(this_00,(ulong)marked_component_count);
      if (-1 < (this->m_component_list).m_capacity) {
        (this->m_component_list).m_count = 0;
      }
      if (uVar9 != 0) {
        ON_SubDVertexIterator::ON_SubDVertexIterator((ON_SubDVertexIterator *)&local_68,subd);
        local_68.m_edge_index = 0;
        local_68.m_e_current = local_68.m_e_first;
        pOVar5 = (ON_SubDVertex *)local_68.m_e_first;
        while (pOVar5 != (ON_SubDVertex *)0x0) {
          bVar3 = ON_ComponentStatus::RuntimeMark(&(pOVar5->super_ON_SubDComponentBase).m_status);
          if (bVar3 == bComponentInListMark) {
            local_80.m_ptr = (ulong)pOVar5 | 2;
            ON_SimpleArray<ON_SubDComponentPtr>::Append(this_00,&local_80);
          }
          pOVar5 = ON_SubDVertexIterator::NextVertex((ON_SubDVertexIterator *)&local_68);
        }
        ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
      }
      pOVar2 = local_78;
      if (uVar8 != 0) {
        ON_SubDEdgeIterator::ON_SubDEdgeIterator(&local_68,subd);
        local_68.m_edge_index = 0;
        local_68.m_e_current = local_68.m_e_first;
        pOVar5 = (ON_SubDVertex *)local_68.m_e_first;
        while (pOVar5 != (ON_SubDVertex *)0x0) {
          bVar3 = ON_ComponentStatus::RuntimeMark(&(pOVar5->super_ON_SubDComponentBase).m_status);
          if (bVar3 == bComponentInListMark) {
            local_80.m_ptr = (ulong)pOVar5 | 4;
            ON_SimpleArray<ON_SubDComponentPtr>::Append(this_00,&local_80);
          }
          pOVar5 = (ON_SubDVertex *)ON_SubDEdgeIterator::NextEdge(&local_68);
        }
        ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
      }
      if ((int)local_70 != 0) {
        ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)&local_68,subd);
        local_68.m_edge_index = 0;
        local_68.m_e_current = local_68.m_e_first;
        pOVar5 = (ON_SubDVertex *)local_68.m_e_first;
        while (pOVar5 != (ON_SubDVertex *)0x0) {
          bVar3 = ON_ComponentStatus::RuntimeMark(&(pOVar5->super_ON_SubDComponentBase).m_status);
          if (bVar3 == bComponentInListMark) {
            local_80.m_ptr = (ulong)pOVar5 | 6;
            ON_SimpleArray<ON_SubDComponentPtr>::Append(this_00,&local_80);
          }
          pOVar5 = (ON_SubDVertex *)ON_SubDFaceIterator::NextFace((ON_SubDFaceIterator *)&local_68);
        }
        ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
      }
      uVar7 = 0;
      if ((pOVar2->m_component_list).m_count != 0) {
        ON_SubD::ShareDimple(&pOVar2->m_subd,subd);
        peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (peVar1 == (element_type *)0x0) {
          OVar6 = 0;
        }
        else {
          OVar6 = peVar1->RuntimeSerialNumber;
        }
        pOVar2->m_subd_runtime_serial_number = OVar6;
        OVar6 = ON_SubD::GeometryContentSerialNumber(subd);
        pOVar2->m_subd_geometry_content_serial_number = OVar6;
        OVar6 = ON_SubD::RenderContentSerialNumber(subd);
        pOVar2->m_subd_render_content_serial_number = OVar6;
        uVar7 = (pOVar2->m_component_list).m_count;
      }
    }
  }
  return uVar7;
}

Assistant:

unsigned ON_SubDComponentList::Internal_Create(const ON_SubD & subd, bool bAddVertices, bool bAddEdges, bool bAddFaces, bool bComponentInListMark, unsigned marked_component_count)
{
  Destroy();

  if (0 == marked_component_count)
    return 0;

  const unsigned face_count = bAddFaces ? subd.FaceCount() : 0U;
  const unsigned edge_count = bAddEdges ? subd.EdgeCount() : 0U;
  const unsigned vertex_count = bAddVertices ? subd.VertexCount() : 0U;
  if (0 == vertex_count && 0 == edge_count && 0 == face_count)
    return 0;

  if (marked_component_count > vertex_count + edge_count + face_count)
    return 0;

  bComponentInListMark = bComponentInListMark ? true : false;
  m_component_list.Reserve(marked_component_count);
  m_component_list.SetCount(0);
  if (vertex_count > 0)
  {
    ON_SubDVertexIterator vit(subd);
    for (const ON_SubDVertex* v = vit.FirstVertex(); nullptr != v; v = vit.NextVertex())
    {
      if (bComponentInListMark != v->m_status.RuntimeMark())
        continue;
      m_component_list.Append(v->ComponentPtr());
    }
  }
  if (edge_count > 0)
  {
    ON_SubDEdgeIterator eit(subd);
    for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
    {
      if (bComponentInListMark != e->m_status.RuntimeMark())
        continue;
      m_component_list.Append(e->ComponentPtr());
    }
  }
  if (face_count > 0)
  {
    ON_SubDFaceIterator fit(subd);
    for (const ON_SubDFace* f = fit.FirstFace(); nullptr != f; f = fit.NextFace())
    {
      if (bComponentInListMark != f->m_status.RuntimeMark())
        continue;
      m_component_list.Append(f->ComponentPtr());
    }
  }

  if (m_component_list.UnsignedCount() > 0)
  {
    m_subd.ShareDimple(subd);
    m_subd_runtime_serial_number = subd.RuntimeSerialNumber();
    m_subd_geometry_content_serial_number = subd.GeometryContentSerialNumber();
    m_subd_render_content_serial_number = subd.RenderContentSerialNumber();
  }
  return m_component_list.UnsignedCount();
}